

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O2

void CB_EXPLORE_ADF::predict_or_learn_softmax<true>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  example *peVar1;
  score_iterator local_78;
  score_iterator local_68;
  score_iterator local_58;
  score_iterator local_48;
  score_iterator local_38;
  score_iterator local_28;
  
  peVar1 = test_adf_sequence(examples);
  if (peVar1 == (example *)0x0) {
    LEARNER::multiline_learn_or_predict<false>(base,examples,data->offset,0);
  }
  else {
    LEARNER::multiline_learn_or_predict<true>(base,examples,data->offset,0);
  }
  peVar1 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_48._p = (action_score *)(peVar1->pred).scalars._begin;
  local_28._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_58._p = (action_score *)(peVar1->pred).scalars._end;
  local_38._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_48._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_58._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_38._p = local_58._p;
  local_28._p = local_48._p;
  exploration::generate_softmax<ACTION_SCORE::score_iterator,ACTION_SCORE::score_iterator>
            (data->lambda,&local_28,&local_38,&local_48,&local_58);
  local_68._p = (action_score *)(peVar1->pred).scalars._begin;
  local_68._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_78._p = (action_score *)(peVar1->pred).scalars._end;
  local_78._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
            (data->epsilon,true,&local_68,&local_78);
  return;
}

Assistant:

void predict_or_learn_softmax(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  if (is_learn && test_adf_sequence(examples) != nullptr)
    multiline_learn_or_predict<true>(base, examples, data.offset);
  else
    multiline_learn_or_predict<false>(base, examples, data.offset);

  v_array<action_score>& preds = examples[0]->pred.a_s;
  generate_softmax(data.lambda, begin_scores(preds), end_scores(preds), begin_scores(preds), end_scores(preds));

  enforce_minimum_probability(data.epsilon, true, begin_scores(preds), end_scores(preds));
}